

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Instr * __thiscall IR::Instr::GetPrevRealInstrOrLabel(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *this_00;
  
  this_00 = this->m_prev;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while ((this_00->m_kind != InstrKindLabel && (this_00->m_kind != InstrKindProfiledLabel))) {
    bVar2 = IsRealInstr(this_00);
    if (bVar2) {
      return this_00;
    }
    this_00 = this_00->m_prev;
    if (this_00 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xb4b,"(instr)","GetPrevRealInstrOrLabel() failed...");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return this_00;
}

Assistant:

IR::Instr *
Instr::GetPrevRealInstrOrLabel() const
{
    IR::Instr *instr = this->m_prev;

    while (!instr->IsLabelInstr() && !instr->IsRealInstr())
    {
        instr = instr->m_prev;
        AssertMsg(instr, "GetPrevRealInstrOrLabel() failed...");
    }
    return instr;
}